

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscanf.c
# Opt level: O3

int sscanf_s(char *string,char *format,...)

{
  char in_AL;
  int iVar1;
  size_t sVar2;
  int *piVar3;
  undefined8 in_RCX;
  unsigned_long uVar4;
  size_t sVar5;
  undefined8 in_RDX;
  char *pcVar6;
  undefined8 in_R8;
  undefined8 in_R9;
  tSafeCRT_AssertFuncPtr p_Var7;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arglist;
  __va_list_tag local_118;
  miniFILE local_f8;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  local_118.reg_save_area = local_d8;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_118.overflow_arg_area = &arglist[0].overflow_arg_area;
  local_118.gp_offset = 0x10;
  local_118.fp_offset = 0x30;
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  sVar2 = strlen(string);
  if (sMBUSafeCRTAssertFunc == (tSafeCRT_AssertFuncPtr)0x0 || string != (char *)0x0) {
    if (string != (char *)0x0) {
      if (format == (char *)0x0 && sMBUSafeCRTAssertFunc != (tSafeCRT_AssertFuncPtr)0x0) {
        (*sMBUSafeCRTAssertFunc)
                  ("\"(format != NULL)\"","SafeCRT assert failed",
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/sscanf.c"
                   ,0x32);
      }
      else if (format != (char *)0x0) {
        local_f8._flag = 0xd;
        sVar5 = 0x7fffffff;
        if (sVar2 < 0x7fffffff) {
          sVar5 = sVar2;
        }
        local_f8._cnt = (int)sVar5;
        local_f8._ptr = string;
        local_f8._base = string;
        iVar1 = __tinput_s(&local_f8,(_TUCHAR *)format,&local_118);
        return iVar1;
      }
      p_Var7 = sMBUSafeCRTAssertFunc;
      piVar3 = __errno_location();
      *piVar3 = 0x16;
      if (p_Var7 == (tSafeCRT_AssertFuncPtr)0x0) {
        return -1;
      }
      pcVar6 = "\"(format != NULL)\"";
      uVar4 = 0x32;
      goto LAB_00321edd;
    }
  }
  else {
    (*sMBUSafeCRTAssertFunc)
              ("\"(string != NULL)\"","SafeCRT assert failed",
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/sscanf.c"
               ,0x31);
  }
  p_Var7 = sMBUSafeCRTAssertFunc;
  piVar3 = __errno_location();
  *piVar3 = 0x16;
  if (p_Var7 == (tSafeCRT_AssertFuncPtr)0x0) {
    return -1;
  }
  pcVar6 = "\"(string != NULL)\"";
  uVar4 = 0x31;
LAB_00321edd:
  (*p_Var7)(pcVar6,"SafeCRT assert failed",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/sscanf.c"
            ,uVar4);
  return -1;
}

Assistant:

int __cdecl sscanf_s (
        const char *string,
        const char *format,
        ...
        )
{
        int ret;
        va_list arglist;
        va_start(arglist, format);
        ret = vscan_fn(__tinput_s, string, format, arglist);
        va_end(arglist);
        return ret;
}